

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void get_range<float,long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
               long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar14 = Xc_indptr[col_num];
  lVar4 = Xc_indptr[col_num + 1];
  bVar8 = true;
  if (lVar4 == lVar14) goto LAB_002b19b7;
  uVar10 = Xc_ind[lVar14];
  if ((long)ix_arr[end] < (long)uVar10) goto LAB_002b19b7;
  lVar1 = lVar4 + -1;
  uVar5 = Xc_ind[lVar1];
  if ((long)uVar5 < (long)ix_arr[st]) goto LAB_002b19b7;
  puVar3 = ix_arr + end;
  puVar12 = ix_arr + st;
  uVar9 = (end - st) + 1;
  if (((long)ix_arr[st] < (long)uVar10 || (ulong)(lVar4 - lVar14) < uVar9) ||
      (long)uVar5 < (long)ix_arr[end]) {
    *xmin = 0.0;
    *xmax = 0.0;
  }
  puVar2 = puVar3 + 1;
  uVar11 = (long)puVar2 - (long)puVar12 >> 3;
  if (missing_action == Fail) {
    while (0 < (long)uVar11) {
      uVar13 = uVar11 >> 1;
      uVar17 = ~uVar13 + uVar11;
      uVar11 = uVar13;
      if (puVar12[uVar13] < uVar10) {
        puVar12 = puVar12 + uVar13 + 1;
        uVar11 = uVar17;
      }
    }
    if (lVar4 == lVar14 || puVar12 == puVar2) goto LAB_002b1944;
    dVar18 = *xmax;
    dVar19 = *xmin;
    lVar7 = lVar1 * 8 + 8;
    uVar10 = 0;
    while (uVar11 = *puVar12, uVar11 <= uVar5) {
      puVar16 = (ulong *)(Xc_ind + lVar14);
      uVar13 = *puVar16;
      if (uVar13 == uVar11) {
        uVar10 = uVar10 + 1;
        dVar20 = (double)Xc[lVar14];
        dVar21 = dVar20;
        if (dVar19 <= dVar20) {
          dVar21 = dVar19;
        }
        dVar19 = dVar21;
        *xmin = dVar19;
        if (dVar20 <= dVar18) {
          dVar20 = dVar18;
        }
        *xmax = dVar20;
        if ((puVar12 == puVar3) || (lVar14 == lVar1)) break;
        puVar12 = puVar12 + 1;
        uVar11 = (long)Xc_ind + (lVar7 - (long)puVar16) >> 3;
        if (0 < (long)uVar11) {
          do {
            uVar13 = uVar11 >> 1;
            uVar17 = ~uVar13 + uVar11;
            uVar11 = uVar13;
            if (puVar16[uVar13] < *puVar12) {
              puVar16 = puVar16 + uVar13 + 1;
              uVar11 = uVar17;
            }
          } while (0 < (long)uVar11);
        }
        lVar14 = (long)puVar16 - (long)Xc_ind;
        dVar18 = dVar20;
LAB_002b1b1b:
        lVar14 = lVar14 >> 3;
      }
      else {
        if ((long)uVar13 <= (long)uVar11) {
          puVar6 = puVar16 + 1;
          uVar13 = (long)Xc_ind + (lVar7 - (long)(puVar16 + 1)) >> 3;
          while (0 < (long)uVar13) {
            uVar17 = uVar13 >> 1;
            uVar15 = ~uVar17 + uVar13;
            uVar13 = uVar17;
            if (puVar6[uVar17] < uVar11) {
              puVar6 = puVar6 + uVar17 + 1;
              uVar13 = uVar15;
            }
          }
          lVar14 = (long)puVar6 - (long)Xc_ind;
          goto LAB_002b1b1b;
        }
        puVar12 = puVar12 + 1;
        uVar11 = (long)puVar2 - (long)puVar12 >> 3;
        while (0 < (long)uVar11) {
          uVar17 = uVar11 >> 1;
          uVar15 = ~uVar17 + uVar11;
          uVar11 = uVar17;
          if (puVar12[uVar17] < uVar13) {
            puVar12 = puVar12 + uVar17 + 1;
            uVar11 = uVar15;
          }
        }
      }
      if ((puVar12 == puVar2) || (lVar14 == lVar4)) break;
    }
  }
  else {
    while (0 < (long)uVar11) {
      uVar13 = uVar11 >> 1;
      uVar17 = ~uVar13 + uVar11;
      uVar11 = uVar13;
      if (puVar12[uVar13] < uVar10) {
        puVar12 = puVar12 + uVar13 + 1;
        uVar11 = uVar17;
      }
    }
    if (lVar4 == lVar14 || puVar12 == puVar2) {
LAB_002b1944:
      uVar10 = 0;
    }
    else {
      dVar18 = *xmax;
      dVar19 = *xmin;
      lVar7 = lVar1 * 8 + 8;
      uVar10 = 0;
      while (uVar11 = *puVar12, uVar11 <= uVar5) {
        puVar16 = (ulong *)(Xc_ind + lVar14);
        uVar13 = *puVar16;
        if (uVar13 == uVar11) {
          uVar10 = uVar10 + 1;
          dVar21 = (double)Xc[lVar14];
          dVar20 = dVar21;
          if (dVar19 <= dVar21) {
            dVar20 = dVar19;
          }
          dVar19 = (double)(~-(ulong)NAN(dVar19) & (ulong)dVar20 |
                           -(ulong)NAN(dVar19) & (ulong)dVar21);
          *xmin = dVar19;
          dVar20 = dVar21;
          if (dVar21 <= dVar18) {
            dVar20 = dVar18;
          }
          dVar18 = (double)(~-(ulong)NAN(dVar18) & (ulong)dVar20 |
                           -(ulong)NAN(dVar18) & (ulong)dVar21);
          *xmax = dVar18;
          if ((puVar12 == puVar3) || (lVar14 == lVar1)) break;
          puVar12 = puVar12 + 1;
          uVar11 = (long)Xc_ind + (lVar7 - (long)puVar16) >> 3;
          if (0 < (long)uVar11) {
            do {
              uVar13 = uVar11 >> 1;
              uVar17 = ~uVar13 + uVar11;
              uVar11 = uVar13;
              if (puVar16[uVar13] < *puVar12) {
                puVar16 = puVar16 + uVar13 + 1;
                uVar11 = uVar17;
              }
            } while (0 < (long)uVar11);
          }
          lVar14 = (long)puVar16 - (long)Xc_ind;
LAB_002b18ea:
          lVar14 = lVar14 >> 3;
        }
        else {
          if ((long)uVar13 <= (long)uVar11) {
            puVar6 = puVar16 + 1;
            uVar13 = (long)Xc_ind + (lVar7 - (long)(puVar16 + 1)) >> 3;
            while (0 < (long)uVar13) {
              uVar17 = uVar13 >> 1;
              uVar15 = ~uVar17 + uVar13;
              uVar13 = uVar17;
              if (puVar6[uVar17] < uVar11) {
                puVar6 = puVar6 + uVar17 + 1;
                uVar13 = uVar15;
              }
            }
            lVar14 = (long)puVar6 - (long)Xc_ind;
            goto LAB_002b18ea;
          }
          puVar12 = puVar12 + 1;
          uVar11 = (long)puVar2 - (long)puVar12 >> 3;
          while (0 < (long)uVar11) {
            uVar17 = uVar11 >> 1;
            uVar15 = ~uVar17 + uVar11;
            uVar11 = uVar17;
            if (puVar12[uVar17] < uVar13) {
              puVar12 = puVar12 + uVar17 + 1;
              uVar11 = uVar15;
            }
          }
        }
        if ((puVar12 == puVar2) || (lVar14 == lVar4)) break;
      }
    }
  }
  if (uVar10 < uVar9) {
    dVar18 = *xmin;
    if (0.0 <= *xmin) {
      dVar18 = 0.0;
    }
    *xmin = dVar18;
    dVar18 = *xmax;
    if (*xmax <= 0.0) {
      dVar18 = 0.0;
    }
    *xmax = dVar18;
  }
  dVar18 = *xmin;
  dVar19 = *xmax;
  if (((dVar18 != dVar19) || (NAN(dVar18) || NAN(dVar19))) &&
     (dVar19 != -INFINITY || dVar18 != INFINITY)) {
    bVar8 = NAN(dVar19);
  }
LAB_002b19b7:
  *unsplittable = bVar8;
  return;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}